

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::callers
          (FuncVec *__return_storage_ptr__,LazyLLVMCallGraph *this,Function *F)

{
  pointer ppFVar1;
  FuncNode *pFVar2;
  pointer ppFVar3;
  Function *local_40;
  _Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = F;
  getCallsOf((vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *)&local_38,
             this,F);
  std::_Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>::~_Vector_base
            (&local_38);
  pFVar2 = GenericCallGraph<const_llvm::Function_*>::get(&this->_cg,&local_40);
  ppFVar1 = (pFVar2->_callers).
            super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar3 = (pFVar2->_callers).
                 super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar3 != ppFVar1;
      ppFVar3 = ppFVar3 + 1) {
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
              (__return_storage_ptr__,&(*ppFVar3)->value);
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callers(const llvm::Function *F) override {
        FuncVec ret;
        // make sure we have the callers
        // (this will find also caller functions)
        getCallsOf(F);

        auto fnd = _cg.get(F);
        assert(fnd);
        for (auto *nd : fnd->getCallers()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }